

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O0

vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_> *
google::protobuf::MapTestUtil::GetMapEntries<proto2_unittest::TestMap>
          (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           *__return_storage_ptr__,TestMap *message,int index)

{
  Descriptor *pDVar1;
  TestMap *pTVar2;
  Reflection *pRVar3;
  FieldDescriptor *pFVar4;
  string_view local_1d8;
  Message *local_1c8;
  string_view local_1c0;
  Message *local_1b0;
  string_view local_1a8;
  Message *local_198;
  string_view local_190;
  Message *local_180;
  string_view local_178;
  Message *local_168;
  string_view local_160;
  Message *local_150;
  string_view local_148;
  Message *local_138;
  string_view local_130;
  Message *local_120;
  string_view local_118;
  Message *local_108;
  string_view local_100;
  Message *local_f0;
  string_view local_e8;
  Message *local_d8;
  string_view local_d0;
  Message *local_c0;
  string_view local_b8;
  Message *local_a8;
  string_view local_a0;
  Message *local_90;
  string_view local_88;
  Message *local_78;
  string_view local_70;
  Message *local_60;
  string_view local_58 [2];
  Message *local_38;
  undefined1 local_29;
  Descriptor *local_28;
  Descriptor *descriptor;
  TestMap *pTStack_18;
  int index_local;
  TestMap *message_local;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *result;
  
  descriptor._4_4_ = index;
  pTStack_18 = message;
  message_local = (TestMap *)__return_storage_ptr__;
  local_28 = proto2_unittest::TestMap::GetDescriptor();
  local_29 = 0;
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector(__return_storage_ptr__);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_58,"map_int32_int32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_58[0]);
  local_38 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_38);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"map_int64_int64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_70);
  local_60 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_60);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"map_uint32_uint32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_88);
  local_78 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_78);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a0,"map_uint64_uint64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_a0);
  local_90 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_90);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,"map_sint32_sint32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_b8);
  local_a8 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_a8);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d0,"map_sint64_sint64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_d0);
  local_c0 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_c0);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"map_fixed32_fixed32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_e8);
  local_d8 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_d8);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_100,"map_fixed64_fixed64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_100);
  local_f0 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_f0);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,"map_sfixed32_sfixed32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_118);
  local_108 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_108);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,"map_sfixed64_sfixed64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_130);
  local_120 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_120);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"map_int32_float");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_148);
  local_138 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_138);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_160,"map_int32_double");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_160);
  local_150 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_150);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_178,"map_bool_bool");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_178);
  local_168 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_168);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,"map_string_string");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_190);
  local_180 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_180);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,"map_int32_bytes");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_1a8);
  local_198 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_198);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c0,"map_int32_enum");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_1c0);
  local_1b0 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_1b0);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_18;
  pDVar1 = local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1d8,"map_int32_foreign_message");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_1d8);
  local_1c8 = Reflection::GetRepeatedMessage(pRVar3,&pTVar2->super_Message,pFVar4,descriptor._4_4_);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Message*> MapTestUtil::GetMapEntries(const TestMap& message,
                                                       int index) {
  const Descriptor* descriptor = message.GetDescriptor();
  std::vector<const Message*> result;

  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int32_int32"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int64_int64"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_uint32_uint32"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_uint64_uint64"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_sint32_sint32"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_sint64_sint64"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_fixed32_fixed32"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_fixed64_fixed64"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_sfixed32_sfixed32"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_sfixed64_sfixed64"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int32_float"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int32_double"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_bool_bool"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_string_string"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int32_bytes"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int32_enum"), index));
  result.push_back(&message.GetReflection()->GetRepeatedMessage(
      message, descriptor->FindFieldByName("map_int32_foreign_message"),
      index));

  return result;
}